

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void evsig_set_base_(event_base *base)

{
  if (evsig_base_lock == (void *)0x0) {
    evsig_base_n_signals_added = (base->sig).ev_n_signals_added;
    evsig_base_fd = (base->sig).ev_signal_pair[1];
  }
  else {
    (*evthread_lock_fns_.lock)(0,evsig_base_lock);
    evsig_base_n_signals_added = (base->sig).ev_n_signals_added;
    evsig_base_fd = (base->sig).ev_signal_pair[1];
    if (evsig_base_lock != (void *)0x0) {
      evsig_base = base;
      (*evthread_lock_fns_.unlock)(0,evsig_base_lock);
      return;
    }
  }
  evsig_base = base;
  return;
}

Assistant:

void
evsig_set_base_(struct event_base *base)
{
	EVSIGBASE_LOCK();
	evsig_base = base;
	evsig_base_n_signals_added = base->sig.ev_n_signals_added;
	evsig_base_fd = base->sig.ev_signal_pair[1];
	EVSIGBASE_UNLOCK();
}